

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O1

char_t __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::get(input_stream_t<cfgfile::string_trait_t> *this)

{
  iterator *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Elt_pointer ppVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [15];
  bool bVar7;
  _Elt_pointer pcVar8;
  char_t ch;
  undefined1 local_28 [8];
  pos_t pStack_20;
  
  bVar7 = at_end(this);
  if (bVar7) {
    local_28[0] = '\0';
  }
  else {
    uVar2 = this->m_line_number;
    uVar3 = this->m_column_number;
    register0x00001208 = (int)uVar2;
    local_28 = uVar3;
    register0x0000120c = (int)((ulong)uVar2 >> 0x20);
    ppVar4 = (this->m_prev_positions).c.
             super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar4 == (this->m_prev_positions).c.
                  super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
      ::_M_push_back_aux<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>
                (&(this->m_prev_positions).c,(position_t *)local_28);
    }
    else {
      ppVar4->m_column_number = uVar3;
      ppVar4->m_line_number = pStack_20;
      piVar1 = &(this->m_prev_positions).c.
                super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    this->m_column_number = this->m_column_number + 1;
    auVar6 = stack0xffffffffffffffd9;
    auVar5[0xf] = 0;
    auVar5._0_15_ = stack0xffffffffffffffd9;
    _local_28 = (position_t)(auVar5 << 8);
    pcVar8 = (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pcVar8 == (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      if (this->m_buf_pos == 0x200) {
        string_trait_t::fill_buf
                  (this->m_stream,&this->m_buf,0x200,&this->m_stream_pos,this->m_stream_size);
        this->m_buf_pos = 0;
      }
      local_28[0] = (this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[this->m_buf_pos];
      this->m_buf_pos = this->m_buf_pos + 1;
    }
    else {
      if (pcVar8 == (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_first) {
        pcVar8 = (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
      }
      local_28[0] = pcVar8[-1];
      _local_28 = (position_t)CONCAT151(auVar6,local_28[0]);
      std::deque<char,_std::allocator<char>_>::pop_back(&(this->m_returned_char).c);
    }
    bVar7 = is_new_line(this,local_28);
    if (bVar7) {
      this->m_line_number = this->m_line_number + 1;
      this->m_column_number = 1;
    }
  }
  return local_28[0];
}

Assistant:

typename Trait::char_t get()
	{
		if( !at_end() )
		{
			m_prev_positions.push( { m_column_number, m_line_number } );

			m_column_number += 1;

			typename Trait::char_t ch( 0x00 );

			if( !m_returned_char.empty() )
			{
				ch = m_returned_char.top();

				m_returned_char.pop();

				if( is_new_line( ch ) )
				{
					m_line_number += 1;
					m_column_number = 1;
				}

				return ch;
			}

			if( m_buf_pos == c_buff_size )
			{
				Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
				m_buf_pos = 0;
			}

			ch = m_buf[ m_buf_pos ];

			++m_buf_pos;

			if( is_new_line( ch ) )
			{
				m_line_number += 1;
				m_column_number = 1;
			}

			return ch;
		}
		else
			return typename Trait::char_t( 0x00 );
	}